

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

int xmlIsRef(xmlDocPtr doc,xmlNodePtr elem,xmlAttrPtr attr)

{
  xmlAttributePtr pxVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = 0;
  uVar3 = 0;
  if ((((attr != (xmlAttrPtr)0x0) &&
       ((doc != (xmlDocPtr)0x0 || (doc = attr->doc, doc != (_xmlDoc *)0x0)))) &&
      ((doc->intSubset != (xmlDtdPtr)0x0 || (doc->extSubset != (_xmlDtd *)0x0)))) &&
     (((uVar2 = uVar3, elem != (xmlNodePtr)0x0 && (doc->type != XML_HTML_DOCUMENT_NODE)) &&
      ((pxVar1 = xmlGetDtdAttrDesc(doc->intSubset,elem->name,attr->name),
       pxVar1 != (xmlAttributePtr)0x0 ||
       ((doc->extSubset != (xmlDtdPtr)0x0 &&
        (pxVar1 = xmlGetDtdAttrDesc(doc->extSubset,elem->name,attr->name),
        pxVar1 != (xmlAttributePtr)0x0)))))))) {
    uVar2 = (uint)(pxVar1->atype - XML_ATTRIBUTE_IDREF < 2);
  }
  return uVar2;
}

Assistant:

int
xmlIsRef(xmlDocPtr doc, xmlNodePtr elem, xmlAttrPtr attr) {
    if (attr == NULL)
        return(0);
    if (doc == NULL) {
        doc = attr->doc;
	if (doc == NULL) return(0);
    }

    if ((doc->intSubset == NULL) && (doc->extSubset == NULL)) {
        return(0);
    } else if (doc->type == XML_HTML_DOCUMENT_NODE) {
        /* TODO @@@ */
        return(0);
    } else {
        xmlAttributePtr attrDecl;

        if (elem == NULL) return(0);
        attrDecl = xmlGetDtdAttrDesc(doc->intSubset, elem->name, attr->name);
        if ((attrDecl == NULL) && (doc->extSubset != NULL))
            attrDecl = xmlGetDtdAttrDesc(doc->extSubset,
		                         elem->name, attr->name);

	if ((attrDecl != NULL) &&
	    (attrDecl->atype == XML_ATTRIBUTE_IDREF ||
	     attrDecl->atype == XML_ATTRIBUTE_IDREFS))
	return(1);
    }
    return(0);
}